

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bitpacking.cpp
# Opt level: O0

void duckdb::BitpackingCompressionState<long,_true,_long>::BitpackingWriter::UpdateStats
               (BitpackingCompressionState<long,_true,_long> *state,idx_t count)

{
  pointer pCVar1;
  BaseStatistics *in_RSI;
  long in_RDI;
  BaseStatistics *this;
  
  this = in_RSI;
  pCVar1 = unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::
           operator->((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                       *)in_RSI);
  ::std::__atomic_base<unsigned_long>::operator+=
            (&(pCVar1->super_SegmentBase<duckdb::ColumnSegment>).count.
              super___atomic_base<unsigned_long>,(__int_type)in_RSI);
  if ((*(byte *)(in_RDI + 0x88b1) & 1) == 0) {
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)this);
    BaseStatistics::UpdateNumericStats<long>(this,(long)in_RSI);
    unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>::operator->
              ((unique_ptr<duckdb::ColumnSegment,_std::default_delete<duckdb::ColumnSegment>,_true>
                *)this);
    BaseStatistics::UpdateNumericStats<long>(this,(long)in_RSI);
  }
  return;
}

Assistant:

static void UpdateStats(BitpackingCompressionState<T, WRITE_STATISTICS> *state, idx_t count) {
			state->current_segment->count += count;

			if (WRITE_STATISTICS && !state->state.all_invalid) {
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.maximum);
				state->current_segment->stats.statistics.template UpdateNumericStats<T>(state->state.minimum);
			}
		}